

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetDirFromEnv_abi_cxx11_
                   (initializer_list<const_char_*> environment_variables,char *fallback,
                   char separator)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_t sVar1;
  string *psVar2;
  string *in_RDI;
  allocator<char> in_R8B;
  char *value;
  char *variable_name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  initializer_list<const_char_*> *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  char *in_stack_ffffffffffffff58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_86;
  allocator<char> local_85 [20];
  allocator<char> local_71;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  char *local_48;
  const_iterator local_40;
  const_iterator local_38;
  initializer_list<const_char_*> *local_30;
  allocator<char> local_21;
  initializer_list<const_char_*> local_18;
  
  local_30 = &local_18;
  local_21 = in_R8B;
  local_38 = std::initializer_list<const_char_*>::begin(local_30);
  local_40 = std::initializer_list<const_char_*>::end(in_stack_ffffffffffffff30);
  while( true ) {
    if (local_38 == local_40) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::allocator<char>::~allocator(&local_86);
      return in_RDI;
    }
    local_48 = *local_38;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           internal::posix::GetEnv((char *)0x15089e);
    local_50 = this;
    if ((this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       (this->_M_dataplus != (_Alloc_hider)0x0)) break;
    local_38 = local_38 + 1;
  }
  sVar1 = strlen((char *)this);
  if (*(allocator<char> *)((long)this + (sVar1 - 1)) != local_21) {
    __s = &local_71;
    __a = local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
    psVar2 = (string *)std::__cxx11::string::append((ulong)local_70,'\x01');
    std::__cxx11::string::string((string *)in_RDI,psVar2);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    return in_RDI;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::~allocator(local_85);
  return in_RDI;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}